

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_keywrap.c
# Opt level: O3

int keyWrapCryptoPro(gost_ctx *ctx,uchar *keyExchangeKey,uchar *ukm,uchar *sessionKey,
                    uchar *wrappedKey)

{
  uchar kek_ukm [32];
  uchar auStack_48 [32];
  
  keyDiversifyCryptoPro(ctx,keyExchangeKey,ukm,auStack_48);
  gost_key(ctx,auStack_48);
  *(undefined8 *)wrappedKey = *(undefined8 *)ukm;
  gost_enc(ctx,sessionKey,wrappedKey + 8,4);
  gost_mac_iv(ctx,0x20,ukm,sessionKey,0x20,wrappedKey + 0x28);
  return 1;
}

Assistant:

int keyWrapCryptoPro(gost_ctx * ctx, const unsigned char *keyExchangeKey,
                     const unsigned char *ukm,
                     const unsigned char *sessionKey,
                     unsigned char *wrappedKey)
{
    unsigned char kek_ukm[32];
    keyDiversifyCryptoPro(ctx, keyExchangeKey, ukm, kek_ukm);
    gost_key(ctx, kek_ukm);
    memcpy(wrappedKey, ukm, 8);
    gost_enc(ctx, sessionKey, wrappedKey + 8, 4);
    gost_mac_iv(ctx, 32, ukm, sessionKey, 32, wrappedKey + 40);
    return 1;
}